

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryFuncs.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::builtins::BitsFunction::eval
          (BitsFunction *this,EvalContext *context,Args *args,SourceRange param_4,
          SystemCallInfo *param_5)

{
  bool bVar1;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RCX;
  Expression *in_RDX;
  ConstantValue *in_RDI;
  ConstantValue *in_R8;
  ConstantValue cv;
  uint64_t width;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  EvalContext *in_stack_ffffffffffffff40;
  ConstantValue *this_00;
  Type *in_stack_ffffffffffffff48;
  bitwidth_t bits;
  SVInt *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  SVInt local_60 [2];
  Type *local_38;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *local_30;
  
  local_30 = in_RCX;
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RCX,0);
  bVar1 = SystemSubroutine::noHierarchical
                    ((SystemSubroutine *)in_stack_ffffffffffffff88,
                     (EvalContext *)in_stack_ffffffffffffff80,in_RDX);
  if (bVar1) {
    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](local_30,0);
    not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0xb0e0ed);
    bVar1 = Type::isFixedSize((Type *)in_stack_ffffffffffffff88);
    if (bVar1) {
      std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](local_30,0)
      ;
      not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0xb0e118)
      ;
      local_38 = (Type *)Type::getBitstreamWidth(in_stack_ffffffffffffff48);
      bits = (bitwidth_t)((ulong)in_stack_ffffffffffffff48 >> 0x20);
    }
    else {
      std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](local_30,0)
      ;
      in_stack_ffffffffffffff50 = local_60;
      Expression::eval((Expression *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0xb0e162);
      if (bVar1) {
        in_stack_ffffffffffffff48 = (Type *)slang::ConstantValue::getBitstreamWidth(in_R8);
        local_38 = in_stack_ffffffffffffff48;
      }
      else {
        slang::ConstantValue::ConstantValue
                  ((ConstantValue *)in_stack_ffffffffffffff40,
                   (nullptr_t)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
      }
      bits = (bitwidth_t)((ulong)in_stack_ffffffffffffff48 >> 0x20);
      slang::ConstantValue::~ConstantValue((ConstantValue *)0xb0e1d9);
      if (!bVar1) {
        return in_RDI;
      }
    }
    this_00 = (ConstantValue *)&stack0xffffffffffffff80;
    SVInt::SVInt(in_stack_ffffffffffffff50,bits,(uint64_t)this_00,(bool)in_stack_ffffffffffffff3f);
    slang::ConstantValue::ConstantValue
              (this_00,(SVInt *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
    SVInt::~SVInt(in_stack_ffffffffffffff50);
  }
  else {
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_ffffffffffffff40,
               (nullptr_t)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
  }
  return in_RDI;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange,
                       const CallExpression::SystemCallInfo&) const final {
        if (!noHierarchical(context, *args[0]))
            return nullptr;

        uint64_t width;
        if (args[0]->type->isFixedSize()) {
            width = args[0]->type->getBitstreamWidth();
        }
        else {
            ConstantValue cv = args[0]->eval(context);
            if (!cv)
                return nullptr;
            width = cv.getBitstreamWidth();
        }

        // Note: we convert the size down to a 32-bit result. This can result
        // in (defined) overflow, which matches the behavior of all other
        // tools that I tried.
        return SVInt(32, width, true);
    }